

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

void __thiscall
Js::ScriptContext::RegisterWeakReferenceDictionary
          (ScriptContext *this,IWeakReferenceDictionary *weakReferenceDictionary)

{
  RealCount *pRVar1;
  Type pSVar2;
  
  pSVar2 = (Type)new<Memory::ArenaAllocator>(0x10,&this->generalAllocator,0x364470);
  pSVar2[1].next = (Type)weakReferenceDictionary;
  pSVar2->next = (this->weakReferenceDictionaryList).super_SListNodeBase<Memory::ArenaAllocator>.
                 next;
  (this->weakReferenceDictionaryList).super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar2;
  pRVar1 = &(this->weakReferenceDictionaryList).super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  return;
}

Assistant:

void ScriptContext::RegisterWeakReferenceDictionary(JsUtil::IWeakReferenceDictionary* weakReferenceDictionary)
    {
        this->weakReferenceDictionaryList.Prepend(this->GeneralAllocator(), weakReferenceDictionary);
    }